

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O1

void __thiscall dpfb::Font::readKerningPairs(Font *this)

{
  pointer *ppKVar1;
  ushort uVar2;
  ushort uVar3;
  KerningSource KVar4;
  iterator __position;
  pointer pRVar5;
  char32_t cVar6;
  char32_t cVar7;
  pointer pRVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pRVar11;
  ulong uVar12;
  KerningParams kerningParams;
  vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> local_68;
  ulong local_48;
  KerningParams local_40;
  vector<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_> *local_38;
  
  local_40.pxSize = (this->bakingOptions).fontPxSize;
  local_40.pxPerEm = (int)(this->head).unitsPerEm;
  if (((this->bakingOptions).kerningSource & ~kern) == gpos) {
    readKerningPairsGpos
              (&local_68,&(this->fontStream).super_Stream,&this->sfntOffsetTable,&local_40);
    pRVar8 = local_68.
             super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pRVar11 = local_68.
              super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pRVar11 = (pointer)0x0;
    pRVar8 = (pointer)0x0;
  }
  KVar4 = (this->bakingOptions).kerningSource;
  if ((KVar4 == kern) || ((KVar4 == kernAndGpos && (pRVar11 == pRVar8)))) {
    readKerningPairsKern
              (&local_68,&(this->fontStream).super_Stream,&this->sfntOffsetTable,&local_40);
    pRVar8 = local_68.
             super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pRVar5 = local_68.
             super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
             .super__Vector_impl_data._M_start;
    local_68.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pRVar11 != (pointer)0x0) {
      operator_delete(pRVar11);
    }
    pRVar11 = pRVar5;
    if (local_68.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (pRVar11 != pRVar8) {
    sortGlyphs(this,glyphIdx);
    uVar9 = (long)pRVar8 - (long)pRVar11 >> 3;
    local_38 = &this->kerningPairs;
    uVar10 = 0;
    local_48 = uVar9;
    do {
      if (pRVar11[uVar10].amount == 0) {
        __assert_fail("rawKerningPair.amount != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/font.cpp"
                      ,0x27a,"void dpfb::Font::readKerningPairs()");
      }
      uVar2 = pRVar11[uVar10].glyphIdx1;
      cVar6 = glyphIdxToCp(this,(uint)uVar2);
      uVar12 = uVar10;
      do {
        uVar10 = uVar12;
        if (uVar9 <= uVar12) break;
        uVar3 = pRVar11[uVar12].glyphIdx1;
        if (uVar3 == uVar2) {
          if (pRVar11[uVar12].amount == 0) {
            __assert_fail("rawKerningPair.amount != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/font.cpp"
                          ,0x28b,"void dpfb::Font::readKerningPairs()");
          }
          uVar10 = uVar12 + 1;
          if ((cVar6 != L'\0') &&
             (cVar7 = glyphIdxToCp(this,(uint)pRVar11[uVar12].glyphIdx2), uVar9 = local_48,
             cVar7 != L'\0')) {
            local_68.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(cVar7,cVar6);
            local_68.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(local_68.
                                   super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   pRVar11[uVar12].amount);
            __position._M_current =
                 (this->kerningPairs).
                 super__Vector_base<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->kerningPairs).
                super__Vector_base<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_>::
              _M_realloc_insert<dpfb::KerningPair>(local_38,__position,(KerningPair *)&local_68);
              uVar9 = local_48;
            }
            else {
              (__position._M_current)->amount = pRVar11[uVar12].amount;
              *(pointer *)__position._M_current =
                   local_68.
                   super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              ppKVar1 = &(this->kerningPairs).
                         super__Vector_base<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppKVar1 = *ppKVar1 + 1;
            }
          }
        }
        uVar12 = uVar10;
      } while (uVar3 == uVar2);
    } while (uVar10 < uVar9);
  }
  if (pRVar11 != (pointer)0x0) {
    operator_delete(pRVar11);
  }
  return;
}

Assistant:

void Font::readKerningPairs()
{
    const KerningParams kerningParams {
        bakingOptions.fontPxSize,
        head.unitsPerEm
    };

    std::vector<RawKerningPair> rawKerningPairs;
    if (bakingOptions.kerningSource == KerningSource::gpos
            || bakingOptions.kerningSource == KerningSource::kernAndGpos)
        rawKerningPairs = readKerningPairsGpos(
            fontStream, sfntOffsetTable, kerningParams);

    // According to the OpenType manual, the "kern" table should be
    // applied when there is no GPOS table, or if the GPOS table doesn't
    // contain any "kern" features for the resolved language.
    // https://docs.microsoft.com/en-us/typography/opentype/spec/recom
    if (bakingOptions.kerningSource == KerningSource::kern
            || (bakingOptions.kerningSource == KerningSource::kernAndGpos
                && rawKerningPairs.empty()))
        rawKerningPairs = readKerningPairsKern(
            fontStream, sfntOffsetTable, kerningParams);
    if (rawKerningPairs.empty())
        return;

    // Prepare for binary search
    sortGlyphs(GlyphsOrder::glyphIdx);

    std::size_t i = 0;
    while (i < rawKerningPairs.size()) {
        const auto& rawKerningPair = rawKerningPairs[i];

        assert(rawKerningPair.amount != 0);

        const auto glyphIdx1 = rawKerningPair.glyphIdx1;
        const auto cp1 = glyphIdxToCp(glyphIdx1);

        // The raw pairs are grouped by the first glyph index (but
        // not necessarily fully sorted in case of GPOS as we read
        // pairs for multiple languages), so we can avoid calling
        // glyphIdxToCp() every time for the first code point in a
        // sequence.
        while (i < rawKerningPairs.size()) {
            const auto& rawKerningPair = rawKerningPairs[i];
            if (rawKerningPair.glyphIdx1 != glyphIdx1)
                break;

            ++i;

            assert(rawKerningPair.amount != 0);

            if (cp1 == 0)
                continue;

            const auto cp2 = glyphIdxToCp(rawKerningPair.glyphIdx2);
            if (cp2 == 0)
                continue;

            kerningPairs.push_back({cp1, cp2, rawKerningPair.amount});
        }
    }
}